

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void switch_tss_ra(CPUX86State *env,int tss_selector,uint32_t e1,uint32_t e2,int source,
                  uint32_t next_eip,uintptr_t retaddr)

{
  target_ulong tVar1;
  target_ulong tVar2;
  CPUX86State *pCVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t val;
  ulong addr;
  long lVar7;
  abi_ptr aVar8;
  int cpl;
  uint32_t e2_2;
  target_ulong ptr_2;
  uint32_t e2_1;
  target_ulong ptr_1;
  target_ulong ptr;
  int index;
  SegmentCache *dt;
  uint32_t local_b0;
  uint32_t eflags_mask;
  uint32_t old_eflags;
  uint32_t new_trap;
  uint32_t new_ldt;
  uint32_t new_cr3;
  uint32_t new_eip;
  uint32_t new_eflags;
  uint32_t new_segs [6];
  uint local_78 [2];
  uint32_t new_regs [8];
  target_ulong tss_base;
  int i;
  int v2;
  int v1;
  int old_type;
  int old_tss_limit_max;
  int type;
  int tss_limit_max;
  int tss_limit;
  uint32_t next_eip_local;
  int source_local;
  uint32_t e2_local;
  uint32_t e1_local;
  int tss_selector_local;
  CPUX86State *env_local;
  
  old_type = e2 >> 8 & 0xf;
  next_eip_local = e2;
  source_local = e1;
  e2_local = tss_selector;
  _e1_local = env;
  if (old_type == 5) {
    if ((e2 & 0x8000) == 0) {
      raise_exception_err_ra_x86_64(env,0xb,tss_selector & 0xfffc,retaddr);
    }
    e2_local = e1 >> 0x10;
    if ((e2_local & 4) != 0) {
      raise_exception_err_ra_x86_64(env,10,e2_local & 0xfffc,retaddr);
    }
    iVar4 = load_segment_ra(env,(uint32_t *)&source_local,&next_eip_local,e2_local,retaddr);
    if (iVar4 != 0) {
      raise_exception_err_ra_x86_64(_e1_local,0xd,e2_local & 0xfffc,retaddr);
    }
    if ((next_eip_local & 0x1000) != 0) {
      raise_exception_err_ra_x86_64(_e1_local,0xd,e2_local & 0xfffc,retaddr);
    }
    old_type = next_eip_local >> 8 & 0xf;
    if ((next_eip_local >> 8 & 7) != 1) {
      raise_exception_err_ra_x86_64(_e1_local,0xd,e2_local & 0xfffc,retaddr);
    }
  }
  if ((next_eip_local & 0x8000) == 0) {
    raise_exception_err_ra_x86_64(_e1_local,0xb,e2_local & 0xfffc,retaddr);
  }
  if ((old_type & 8U) == 0) {
    old_tss_limit_max = 0x2b;
  }
  else {
    old_tss_limit_max = 0x67;
  }
  uVar5 = get_seg_limit(source_local,next_eip_local);
  uVar6 = get_seg_base(source_local,next_eip_local);
  pCVar3 = _e1_local;
  addr = (ulong)uVar6;
  if (((e2_local & 4) != 0) || ((int)uVar5 < old_tss_limit_max)) {
    raise_exception_err_ra_x86_64(_e1_local,10,e2_local & 0xfffc,retaddr);
  }
  if (((_e1_local->tr).flags >> 8 & 8) == 0) {
    v1 = 0x2b;
  }
  else {
    v1 = 0x67;
  }
  if ((old_type & 8U) == 0) {
    new_trap = 0;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    new_ldt = cpu_lduw_mmuidx_ra_x86_64(pCVar3,addr + 0xe,iVar4,retaddr);
    pCVar3 = _e1_local;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    new_cr3 = cpu_lduw_mmuidx_ra_x86_64(pCVar3,addr + 0x10,iVar4,retaddr);
    for (tss_base._4_4_ = 0; pCVar3 = _e1_local, tss_base._4_4_ < 8;
        tss_base._4_4_ = tss_base._4_4_ + 1) {
      iVar4 = cpu_mmu_index_kernel(_e1_local);
      uVar6 = cpu_lduw_mmuidx_ra_x86_64
                        (pCVar3,addr + (long)(tss_base._4_4_ * 2 + 0x12),iVar4,retaddr);
      local_78[tss_base._4_4_] = uVar6 | 0xffff0000;
    }
    for (tss_base._4_4_ = 0; pCVar3 = _e1_local, tss_base._4_4_ < 4;
        tss_base._4_4_ = tss_base._4_4_ + 1) {
      iVar4 = cpu_mmu_index_kernel(_e1_local);
      uVar6 = cpu_lduw_mmuidx_ra_x86_64
                        (pCVar3,addr + (long)(tss_base._4_4_ * 4 + 0x22),iVar4,retaddr);
      (&new_eip)[tss_base._4_4_] = uVar6;
    }
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    old_eflags = cpu_lduw_mmuidx_ra_x86_64(pCVar3,addr + 0x2a,iVar4,retaddr);
    new_segs[2] = 0;
    new_segs[3] = 0;
  }
  else {
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    new_trap = cpu_ldl_mmuidx_ra_x86_64(pCVar3,addr + 0x1c,iVar4,retaddr);
    pCVar3 = _e1_local;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    new_ldt = cpu_ldl_mmuidx_ra_x86_64(pCVar3,addr + 0x20,iVar4,retaddr);
    pCVar3 = _e1_local;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    new_cr3 = cpu_ldl_mmuidx_ra_x86_64(pCVar3,addr + 0x24,iVar4,retaddr);
    for (tss_base._4_4_ = 0; pCVar3 = _e1_local, tss_base._4_4_ < 8;
        tss_base._4_4_ = tss_base._4_4_ + 1) {
      iVar4 = cpu_mmu_index_kernel(_e1_local);
      uVar6 = cpu_ldl_mmuidx_ra_x86_64
                        (pCVar3,addr + (long)(tss_base._4_4_ * 4 + 0x28),iVar4,retaddr);
      local_78[tss_base._4_4_] = uVar6;
    }
    for (tss_base._4_4_ = 0; pCVar3 = _e1_local, tss_base._4_4_ < 6;
        tss_base._4_4_ = tss_base._4_4_ + 1) {
      iVar4 = cpu_mmu_index_kernel(_e1_local);
      uVar6 = cpu_lduw_mmuidx_ra_x86_64
                        (pCVar3,addr + (long)(tss_base._4_4_ * 4 + 0x48),iVar4,retaddr);
      (&new_eip)[tss_base._4_4_] = uVar6;
    }
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    old_eflags = cpu_lduw_mmuidx_ra_x86_64(pCVar3,addr + 0x60,iVar4,retaddr);
    pCVar3 = _e1_local;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_ldl_mmuidx_ra_x86_64(pCVar3,addr + 100,iVar4,retaddr);
  }
  pCVar3 = _e1_local;
  aVar8 = (_e1_local->tr).base;
  iVar4 = cpu_mmu_index_kernel(_e1_local);
  uVar6 = cpu_ldub_mmuidx_ra_x86_64(pCVar3,aVar8,iVar4,retaddr);
  pCVar3 = _e1_local;
  tVar1 = (_e1_local->tr).base;
  iVar4 = cpu_mmu_index_kernel(_e1_local);
  val = cpu_ldub_mmuidx_ra_x86_64(pCVar3,tVar1 + (long)v1,iVar4,retaddr);
  pCVar3 = _e1_local;
  tVar1 = (_e1_local->tr).base;
  iVar4 = cpu_mmu_index_kernel(_e1_local);
  cpu_stb_mmuidx_ra_x86_64(pCVar3,tVar1,uVar6,iVar4,retaddr);
  pCVar3 = _e1_local;
  tVar1 = (_e1_local->tr).base;
  iVar4 = cpu_mmu_index_kernel(_e1_local);
  cpu_stb_mmuidx_ra_x86_64(pCVar3,tVar1 + (long)v1,val,iVar4,retaddr);
  pCVar3 = _e1_local;
  if ((source == 0) || (source == 1)) {
    lVar7 = (_e1_local->gdt).base + (ulong)((_e1_local->tr).selector & 0xfffffff8);
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    uVar6 = cpu_ldl_mmuidx_ra_x86_64(pCVar3,lVar7 + 4,iVar4,retaddr);
    pCVar3 = _e1_local;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,lVar7 + 4,uVar6 & 0xfffffdff,iVar4,retaddr);
  }
  local_b0 = cpu_compute_eflags(_e1_local);
  pCVar3 = _e1_local;
  if (source == 1) {
    local_b0 = local_b0 & 0xffffbfff;
  }
  if ((old_type & 8U) == 0) {
    tVar1 = (_e1_local->tr).base;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0xe,next_eip,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x10,local_b0,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[0];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x12,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[1];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x14,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[2];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x16,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[3];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x18,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[4];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x1a,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[5];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x1c,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[6];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x1e,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[7];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x20,(uint32_t)tVar2,iVar4,retaddr);
    for (tss_base._4_4_ = 0; pCVar3 = _e1_local, tss_base._4_4_ < 4;
        tss_base._4_4_ = tss_base._4_4_ + 1) {
      tVar1 = (_e1_local->tr).base;
      uVar6 = _e1_local->segs[tss_base._4_4_].selector;
      iVar4 = cpu_mmu_index_kernel(_e1_local);
      cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + (long)(tss_base._4_4_ * 4 + 0x22),uVar6,iVar4,retaddr)
      ;
    }
  }
  else {
    tVar1 = (_e1_local->tr).base;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x20,next_eip,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x24,local_b0,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[0];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x28,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[1];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x2c,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[2];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x30,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[3];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x34,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[4];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x38,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[5];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x3c,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[6];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x40,(uint32_t)tVar2,iVar4,retaddr);
    pCVar3 = _e1_local;
    tVar1 = (_e1_local->tr).base;
    tVar2 = _e1_local->regs[7];
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,tVar1 + 0x44,(uint32_t)tVar2,iVar4,retaddr);
    for (tss_base._4_4_ = 0; pCVar3 = _e1_local, tss_base._4_4_ < 6;
        tss_base._4_4_ = tss_base._4_4_ + 1) {
      tVar1 = (_e1_local->tr).base;
      uVar6 = _e1_local->segs[tss_base._4_4_].selector;
      iVar4 = cpu_mmu_index_kernel(_e1_local);
      cpu_stw_mmuidx_ra_x86_64(pCVar3,tVar1 + (long)(tss_base._4_4_ * 4 + 0x48),uVar6,iVar4,retaddr)
      ;
    }
  }
  pCVar3 = _e1_local;
  if (source == 2) {
    uVar6 = (_e1_local->tr).selector;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stw_mmuidx_ra_x86_64(pCVar3,addr,uVar6,iVar4,retaddr);
    new_cr3 = new_cr3 | 0x4000;
  }
  pCVar3 = _e1_local;
  if ((source == 0) || (source == 2)) {
    lVar7 = (_e1_local->gdt).base + (long)(int)(e2_local & 0xfffffff8);
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    uVar6 = cpu_ldl_mmuidx_ra_x86_64(pCVar3,lVar7 + 4,iVar4,retaddr);
    pCVar3 = _e1_local;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    cpu_stl_mmuidx_ra_x86_64(pCVar3,lVar7 + 4,uVar6 | 0x200,iVar4,retaddr);
  }
  _e1_local->cr[0] = _e1_local->cr[0] | 8;
  _e1_local->hflags = _e1_local->hflags | 0x800;
  (_e1_local->tr).selector = e2_local;
  (_e1_local->tr).base = addr;
  (_e1_local->tr).limit = uVar5;
  (_e1_local->tr).flags = next_eip_local & 0xfffffdff;
  if (((old_type & 8U) != 0) && ((_e1_local->cr[0] & 0x80000000) != 0)) {
    cpu_x86_update_cr3_x86_64(_e1_local,(ulong)new_trap);
  }
  _e1_local->eip = (ulong)new_ldt;
  dt._4_4_ = 0x277300;
  if ((old_type & 8U) == 0) {
    dt._4_4_ = 0x7300;
  }
  cpu_load_eflags(_e1_local,new_cr3,dt._4_4_);
  _e1_local->regs[0] = (ulong)local_78[0];
  _e1_local->regs[1] = (ulong)local_78[1];
  _e1_local->regs[2] = (ulong)new_regs[0];
  _e1_local->regs[3] = (ulong)new_regs[1];
  _e1_local->regs[4] = (ulong)new_regs[2];
  _e1_local->regs[5] = (ulong)new_regs[3];
  _e1_local->regs[6] = (ulong)new_regs[4];
  _e1_local->regs[7] = (ulong)new_regs[5];
  if ((new_cr3 & 0x20000) == 0) {
    for (tss_base._4_4_ = 0; tss_base._4_4_ < 6; tss_base._4_4_ = tss_base._4_4_ + 1) {
      cpu_x86_load_seg_cache(_e1_local,tss_base._4_4_,(&new_eip)[tss_base._4_4_],0,0,0);
    }
  }
  else {
    for (tss_base._4_4_ = 0; tss_base._4_4_ < 6; tss_base._4_4_ = tss_base._4_4_ + 1) {
      load_seg_vm(_e1_local,tss_base._4_4_,(&new_eip)[tss_base._4_4_]);
    }
  }
  pCVar3 = _e1_local;
  (_e1_local->ldt).selector = old_eflags & 0xfffffffb;
  (_e1_local->ldt).base = 0;
  (_e1_local->ldt).limit = 0;
  (_e1_local->ldt).flags = 0;
  if ((old_eflags & 4) != 0) {
    raise_exception_err_ra_x86_64(_e1_local,10,old_eflags & 0xfffc,retaddr);
  }
  if ((old_eflags & 0xfffc) != 0) {
    if ((_e1_local->gdt).limit < (old_eflags & 0xfffffff8) + 7) {
      raise_exception_err_ra_x86_64(_e1_local,10,old_eflags & 0xfffc,retaddr);
    }
    aVar8 = (_e1_local->gdt).base + (long)(int)(old_eflags & 0xfffffff8);
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    source_local = cpu_ldl_mmuidx_ra_x86_64(pCVar3,aVar8,iVar4,retaddr);
    pCVar3 = _e1_local;
    iVar4 = cpu_mmu_index_kernel(_e1_local);
    next_eip_local = cpu_ldl_mmuidx_ra_x86_64(pCVar3,aVar8 + 4,iVar4,retaddr);
    if (((next_eip_local & 0x1000) != 0) || ((next_eip_local >> 8 & 0xf) != 2)) {
      raise_exception_err_ra_x86_64(_e1_local,10,old_eflags & 0xfffc,retaddr);
    }
    if ((next_eip_local & 0x8000) == 0) {
      raise_exception_err_ra_x86_64(_e1_local,10,old_eflags & 0xfffc,retaddr);
    }
    load_seg_cache_raw_dt(&_e1_local->ldt,source_local,next_eip_local);
  }
  if ((new_cr3 & 0x20000) == 0) {
    uVar5 = new_eflags & 3;
    tss_load_seg(_e1_local,1,new_eflags,uVar5,retaddr);
    tss_load_seg(_e1_local,2,new_segs[0],uVar5,retaddr);
    tss_load_seg(_e1_local,0,new_eip,uVar5,retaddr);
    tss_load_seg(_e1_local,3,new_segs[1],uVar5,retaddr);
    tss_load_seg(_e1_local,4,new_segs[2],uVar5,retaddr);
    tss_load_seg(_e1_local,5,new_segs[3],uVar5,retaddr);
  }
  if (new_ldt <= _e1_local->segs[1].limit) {
    if ((_e1_local->dr[7] & 0x55) != 0) {
      cpu_x86_update_dr7_x86_64(_e1_local,(uint)_e1_local->dr[7] & 0xffffffaa);
    }
    return;
  }
  raise_exception_err_ra_x86_64(_e1_local,0xd,0,retaddr);
}

Assistant:

static void switch_tss_ra(CPUX86State *env, int tss_selector,
                          uint32_t e1, uint32_t e2, int source,
                          uint32_t next_eip, uintptr_t retaddr)
{
    int tss_limit, tss_limit_max, type, old_tss_limit_max, old_type, v1, v2, i;
    target_ulong tss_base;
    uint32_t new_regs[8], new_segs[6];
    uint32_t new_eflags, new_eip, new_cr3, new_ldt, new_trap;
    uint32_t old_eflags, eflags_mask;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
    LOG_PCALL("switch_tss: sel=0x%04x type=%d src=%d\n", tss_selector, type,
              source);

    /* if task gate, we read the TSS segment and we load it */
    if (type == 5) {
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, tss_selector & 0xfffc, retaddr);
        }
        tss_selector = e1 >> 16;
        if (tss_selector & 4) {
            raise_exception_err_ra(env, EXCP0A_TSS, tss_selector & 0xfffc, retaddr);
        }
        if (load_segment_ra(env, &e1, &e2, tss_selector, retaddr) != 0) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
        if (e2 & DESC_S_MASK) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        if ((type & 7) != 1) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
    }

    if (!(e2 & DESC_P_MASK)) {
        raise_exception_err_ra(env, EXCP0B_NOSEG, tss_selector & 0xfffc, retaddr);
    }

    if (type & 8) {
        tss_limit_max = 103;
    } else {
        tss_limit_max = 43;
    }
    tss_limit = get_seg_limit(e1, e2);
    tss_base = get_seg_base(e1, e2);
    if ((tss_selector & 4) != 0 ||
        tss_limit < tss_limit_max) {
        raise_exception_err_ra(env, EXCP0A_TSS, tss_selector & 0xfffc, retaddr);
    }
    old_type = (env->tr.flags >> DESC_TYPE_SHIFT) & 0xf;
    if (old_type & 8) {
        old_tss_limit_max = 103;
    } else {
        old_tss_limit_max = 43;
    }

    /* read all the registers from the new TSS */
    if (type & 8) {
        /* 32 bit */
        new_cr3 = cpu_ldl_kernel_ra(env, tss_base + 0x1c, retaddr);
        new_eip = cpu_ldl_kernel_ra(env, tss_base + 0x20, retaddr);
        new_eflags = cpu_ldl_kernel_ra(env, tss_base + 0x24, retaddr);
        for (i = 0; i < 8; i++) {
            new_regs[i] = cpu_ldl_kernel_ra(env, tss_base + (0x28 + i * 4),
                                            retaddr);
        }
        for (i = 0; i < 6; i++) {
            new_segs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x48 + i * 4),
                                             retaddr);
        }
        new_ldt = cpu_lduw_kernel_ra(env, tss_base + 0x60, retaddr);
        new_trap = cpu_ldl_kernel_ra(env, tss_base + 0x64, retaddr);
    } else {
        /* 16 bit */
        new_cr3 = 0;
        new_eip = cpu_lduw_kernel_ra(env, tss_base + 0x0e, retaddr);
        new_eflags = cpu_lduw_kernel_ra(env, tss_base + 0x10, retaddr);
        for (i = 0; i < 8; i++) {
            new_regs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x12 + i * 2),
                                             retaddr) | 0xffff0000;
        }
        for (i = 0; i < 4; i++) {
            new_segs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x22 + i * 4),
                                             retaddr);
        }
        new_ldt = cpu_lduw_kernel_ra(env, tss_base + 0x2a, retaddr);
        new_segs[R_FS] = 0;
        new_segs[R_GS] = 0;
        new_trap = 0;
    }
    /* XXX: avoid a compiler warning, see
     http://support.amd.com/us/Processor_TechDocs/24593.pdf
     chapters 12.2.5 and 13.2.4 on how to implement TSS Trap bit */
    (void)new_trap;

    /* NOTE: we must avoid memory exceptions during the task switch,
       so we make dummy accesses before */
    /* XXX: it can still fail in some cases, so a bigger hack is
       necessary to valid the TLB after having done the accesses */

    v1 = cpu_ldub_kernel_ra(env, env->tr.base, retaddr);
    v2 = cpu_ldub_kernel_ra(env, env->tr.base + old_tss_limit_max, retaddr);
    cpu_stb_kernel_ra(env, env->tr.base, v1, retaddr);
    cpu_stb_kernel_ra(env, env->tr.base + old_tss_limit_max, v2, retaddr);

    /* clear busy bit (it is restartable) */
    if (source == SWITCH_TSS_JMP || source == SWITCH_TSS_IRET) {
        target_ulong ptr;
        uint32_t e2;

        ptr = env->gdt.base + (env->tr.selector & ~7);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        e2 &= ~DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, retaddr);
    }
    old_eflags = cpu_compute_eflags(env);
    if (source == SWITCH_TSS_IRET) {
        old_eflags &= ~NT_MASK;
    }

    /* save the current state in the old TSS */
    if (type & 8) {
        /* 32 bit */
        cpu_stl_kernel_ra(env, env->tr.base + 0x20, next_eip, retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + 0x24, old_eflags, retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 0 * 4), env->regs[R_EAX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 1 * 4), env->regs[R_ECX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 2 * 4), env->regs[R_EDX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 3 * 4), env->regs[R_EBX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 4 * 4), env->regs[R_ESP], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 5 * 4), env->regs[R_EBP], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 6 * 4), env->regs[R_ESI], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 7 * 4), env->regs[R_EDI], retaddr);
        for (i = 0; i < 6; i++) {
            cpu_stw_kernel_ra(env, env->tr.base + (0x48 + i * 4),
                              env->segs[i].selector, retaddr);
        }
    } else {
        /* 16 bit */
        cpu_stw_kernel_ra(env, env->tr.base + 0x0e, next_eip, retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + 0x10, old_eflags, retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 0 * 2), env->regs[R_EAX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 1 * 2), env->regs[R_ECX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 2 * 2), env->regs[R_EDX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 3 * 2), env->regs[R_EBX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 4 * 2), env->regs[R_ESP], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 5 * 2), env->regs[R_EBP], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 6 * 2), env->regs[R_ESI], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 7 * 2), env->regs[R_EDI], retaddr);
        for (i = 0; i < 4; i++) {
            cpu_stw_kernel_ra(env, env->tr.base + (0x22 + i * 4),
                              env->segs[i].selector, retaddr);
        }
    }

    /* now if an exception occurs, it will occurs in the next task
       context */

    if (source == SWITCH_TSS_CALL) {
        cpu_stw_kernel_ra(env, tss_base, env->tr.selector, retaddr);
        new_eflags |= NT_MASK;
    }

    /* set busy bit */
    if (source == SWITCH_TSS_JMP || source == SWITCH_TSS_CALL) {
        target_ulong ptr;
        uint32_t e2;

        ptr = env->gdt.base + (tss_selector & ~7);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        e2 |= DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, retaddr);
    }

    /* set the new CPU state */
    /* from this point, any exception which occurs can give problems */
    env->cr[0] |= CR0_TS_MASK;
    env->hflags |= HF_TS_MASK;
    env->tr.selector = tss_selector;
    env->tr.base = tss_base;
    env->tr.limit = tss_limit;
    env->tr.flags = e2 & ~DESC_TSS_BUSY_MASK;

    if ((type & 8) && (env->cr[0] & CR0_PG_MASK)) {
        cpu_x86_update_cr3(env, new_cr3);
    }

    /* load all registers without an exception, then reload them with
       possible exception */
    env->eip = new_eip;
    eflags_mask = TF_MASK | AC_MASK | ID_MASK |
        IF_MASK | IOPL_MASK | VM_MASK | RF_MASK | NT_MASK;
    if (!(type & 8)) {
        eflags_mask &= 0xffff;
    }
    cpu_load_eflags(env, new_eflags, eflags_mask);
    /* XXX: what to do in 16 bit case? */
    env->regs[R_EAX] = new_regs[0];
    env->regs[R_ECX] = new_regs[1];
    env->regs[R_EDX] = new_regs[2];
    env->regs[R_EBX] = new_regs[3];
    env->regs[R_ESP] = new_regs[4];
    env->regs[R_EBP] = new_regs[5];
    env->regs[R_ESI] = new_regs[6];
    env->regs[R_EDI] = new_regs[7];
    if (new_eflags & VM_MASK) {
        for (i = 0; i < 6; i++) {
            load_seg_vm(env, i, new_segs[i]);
        }
    } else {
        /* first just selectors as the rest may trigger exceptions */
        for (i = 0; i < 6; i++) {
            cpu_x86_load_seg_cache(env, i, new_segs[i], 0, 0, 0);
        }
    }

    env->ldt.selector = new_ldt & ~4;
    env->ldt.base = 0;
    env->ldt.limit = 0;
    env->ldt.flags = 0;

    /* load the LDT */
    if (new_ldt & 4) {
        raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
    }

    if ((new_ldt & 0xfffc) != 0) {
        dt = &env->gdt;
        index = new_ldt & ~7;
        if ((index + 7) > dt->limit) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, retaddr);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        if ((e2 & DESC_S_MASK) || ((e2 >> DESC_TYPE_SHIFT) & 0xf) != 2) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        load_seg_cache_raw_dt(&env->ldt, e1, e2);
    }

    /* load the segments */
    if (!(new_eflags & VM_MASK)) {
        int cpl = new_segs[R_CS] & 3;
        tss_load_seg(env, R_CS, new_segs[R_CS], cpl, retaddr);
        tss_load_seg(env, R_SS, new_segs[R_SS], cpl, retaddr);
        tss_load_seg(env, R_ES, new_segs[R_ES], cpl, retaddr);
        tss_load_seg(env, R_DS, new_segs[R_DS], cpl, retaddr);
        tss_load_seg(env, R_FS, new_segs[R_FS], cpl, retaddr);
        tss_load_seg(env, R_GS, new_segs[R_GS], cpl, retaddr);
    }

    /* check that env->eip is in the CS segment limits */
    if (new_eip > env->segs[R_CS].limit) {
        /* XXX: different exception if CALL? */
        raise_exception_err_ra(env, EXCP0D_GPF, 0, retaddr);
    }

    /* reset local breakpoints */
    if (env->dr[7] & DR7_LOCAL_BP_MASK) {
        cpu_x86_update_dr7(env, env->dr[7] & ~DR7_LOCAL_BP_MASK);
    }
}